

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

buffer_appender<char>
fmt::v7::detail::
write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::big_decimal_fp,char>
          (buffer_appender<char> out,big_decimal_fp *fp,basic_format_specs<char> *specs,
          float_specs fspecs,char decimal_point)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  buffer_appender<char> bVar5;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> it;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  buffer<char> *buf;
  int num_zeros;
  sign_t sign;
  int significand_size;
  anon_class_40_7_ef14d3db write;
  char *significand;
  int exp;
  undefined1 local_8d [5];
  big_decimal_fp local_88;
  anon_class_56_7_a2a26a24 local_78;
  char *******local_40;
  int local_34;
  
  local_40 = (char *******)fp->significand;
  local_88.exponent = fp->significand_size;
  local_88.significand._4_4_ = fspecs._4_4_;
  local_88.significand_size = local_88.significand._4_4_ >> 8 & 0xff;
  local_8d[0] = decimal_point;
  local_88.significand = (char *)fspecs;
  if (local_88.exponent < 0) goto LAB_004a2af4;
  uVar8 = (ulong)((local_88.exponent + 1) - (uint)(local_88.significand_size == 0));
  uVar10 = fp->exponent;
  iVar9 = uVar10 + local_88.exponent;
  uVar7 = fspecs.precision;
  if (fspecs._4_1_ != '\x01') {
    if (((ulong)fspecs & 0xff00000000) == 0) {
      uVar11 = 0x10;
      if (0 < (int)uVar7) {
        uVar11 = uVar7;
      }
      if ((iVar9 < -3) || ((int)uVar11 < iVar9)) goto LAB_004a27ea;
    }
    local_34 = iVar9;
    if ((int)uVar10 < 0) {
      if (iVar9 < 1) {
        uVar10 = -iVar9;
        local_8d._1_4_ = uVar10;
        if (SBORROW4(uVar7,uVar10) != (int)(uVar7 + iVar9) < 0) {
          local_8d._1_4_ = uVar7;
        }
        if ((int)uVar7 < 0) {
          local_8d._1_4_ = uVar10;
        }
        if (local_88.exponent != 0) {
          local_8d._1_4_ = uVar10;
        }
        if (-1 < (int)local_8d._1_4_) {
          local_78.sign = (sign_t *)&local_88.significand_size;
          local_78.significand = (char **)(local_8d + 1);
          local_78.significand_size = &local_88.exponent;
          local_78.fp = (big_decimal_fp *)(local_8d + 5);
          local_78.fspecs = (float_specs *)local_8d;
          local_78.decimal_point = (char *)&local_40;
          uVar4 = (ulong)specs->width;
          if (-1 < (long)uVar4) {
            uVar8 = (uint)local_8d._1_4_ + uVar8 + 2;
            uVar6 = 0;
            if (uVar8 <= uVar4) {
              uVar6 = uVar4 - uVar8;
            }
            bVar1 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                             (ulong)((byte)specs->field_0x9 & 0xf));
            if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                 container + 0x18) <
                uVar8 + *(long *)((long)out.
                                        super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                        container + 0x10) + (specs->fill).size_ * uVar6) {
              (*(code *)**(undefined8 **)
                          out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                        (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
            }
            uVar8 = uVar6 >> (bVar1 & 0x3f);
            bVar5 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar8,&specs->fill);
            it.container = (buffer<char> *)
                           write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::big_decimal_fp,_char>
                           ::anon_class_48_6_9afe1116::operator()
                                     ((anon_class_48_6_9afe1116 *)&local_78,
                                      bVar5.
                                      super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                      container);
            goto LAB_004a2ad4;
          }
        }
      }
      else {
        local_8d._1_4_ =
             uVar7 - local_88.exponent & (int)(local_88.significand._4_4_ << 0xb) >> 0x1f;
        local_78.decimal_point = local_8d + 1;
        local_78.sign = (sign_t *)&local_88.significand_size;
        local_78.significand = (char **)&local_40;
        local_78.significand_size = &local_88.exponent;
        local_78.fp = (big_decimal_fp *)&local_34;
        local_78.fspecs = (float_specs *)local_8d;
        uVar4 = (ulong)specs->width;
        if (-1 < (long)uVar4) {
          uVar6 = (ulong)(uint)local_8d._1_4_;
          if ((int)local_8d._1_4_ < 1) {
            uVar6 = 0;
          }
          uVar8 = uVar6 + uVar8 + 1;
          uVar6 = 0;
          if (uVar8 <= uVar4) {
            uVar6 = uVar4 - uVar8;
          }
          bVar1 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                           (ulong)((byte)specs->field_0x9 & 0xf));
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              uVar8 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>
                                      .container + 0x10) + (specs->fill).size_ * uVar6) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          uVar8 = uVar6 >> (bVar1 & 0x3f);
          bVar5 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar8,&specs->fill);
          it.container = (buffer<char> *)
                         write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::big_decimal_fp,_char>
                         ::anon_class_48_6_48d028d1::operator()
                                   ((anon_class_48_6_48d028d1 *)&local_78,
                                    bVar5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>
                                    .container);
          goto LAB_004a2ad4;
        }
      }
    }
    else {
      uVar8 = uVar10 + uVar8;
      local_8d._1_4_ = uVar7 - iVar9;
      if ((local_88.significand._4_4_ >> 0x14 & 1) != 0) {
        if (fspecs._4_1_ != '\x02' && (int)local_8d._1_4_ < 1) {
          local_8d._1_4_ = 1;
        }
        if (0 < (long)(int)local_8d._1_4_) {
          uVar8 = uVar8 + (long)(int)local_8d._1_4_;
        }
      }
      local_78.sign = (sign_t *)&local_88.significand_size;
      local_78.significand = (char **)&local_40;
      local_78.significand_size = &local_88.exponent;
      local_78.fspecs = (float_specs *)(local_8d + 5);
      local_78.decimal_point = local_8d;
      local_78.num_zeros = (int *)(local_8d + 1);
      uVar4 = (ulong)specs->width;
      local_78.fp = fp;
      if (-1 < (long)uVar4) {
        uVar6 = 0;
        if (uVar8 <= uVar4) {
          uVar6 = uVar4 - uVar8;
        }
        bVar1 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                         (ulong)((byte)specs->field_0x9 & 0xf));
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container + 0x18) <
            uVar8 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                    container + 0x10) + (specs->fill).size_ * uVar6) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
        }
        uVar8 = uVar6 >> (bVar1 & 0x3f);
        bVar5 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar8,&specs->fill);
        it.container = (buffer<char> *)
                       write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::big_decimal_fp,_char>
                       ::anon_class_56_7_a2a26a24::operator()
                                 (&local_78,
                                  bVar5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container);
        goto LAB_004a2ad4;
      }
    }
LAB_004a2af4:
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/include/fmt/core.h"
                ,0x146,"negative value");
  }
LAB_004a27ea:
  iVar3 = uVar10 + local_88.exponent + -1;
  if ((local_88.significand._4_4_ >> 0x14 & 1) == 0) {
    uVar6 = 0;
    if (local_88.exponent == 1) {
      local_8d[0] = '\0';
    }
  }
  else {
    uVar6 = 0;
    if (0 < (int)(uVar7 - local_88.exponent)) {
      uVar6 = (ulong)(uVar7 - local_88.exponent);
    }
    uVar8 = uVar8 + uVar6;
  }
  iVar2 = 1 - iVar9;
  if (0 < iVar9) {
    iVar2 = iVar3;
  }
  lVar12 = 2;
  if (99 < iVar2) {
    lVar12 = (ulong)(999 < iVar2) + 3;
  }
  uVar4 = (3 - (ulong)(local_8d[0] == '\0')) + uVar8 + lVar12;
  local_78.sign =
       (sign_t *)
       (CONCAT44(local_78.sign._4_4_,local_88.significand._4_4_ >> 8) & 0xffffffff000000ff);
  local_78.significand_size._0_5_ = CONCAT14(local_8d[0],local_88.exponent);
  local_78.fp = (big_decimal_fp *)
                (CONCAT35(local_78.fp._5_3_,
                          CONCAT14(((local_88.significand._4_4_ >> 0x10 & 1) == 0) << 5,(int)uVar6))
                | 0x4500000000);
  local_78.fspecs = (float_specs *)CONCAT44(local_78.fspecs._4_4_,iVar3);
  uVar8 = (ulong)specs->width;
  local_78.significand = (char **)local_40;
  if ((long)uVar8 < 1) {
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) <
        uVar4 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10)) {
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    bVar5 = write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::big_decimal_fp,_char>
            ::anon_class_40_7_ef14d3db::operator()
                      ((anon_class_40_7_ef14d3db *)&local_78,
                       (iterator)
                       out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    return (buffer_appender<char>)
           bVar5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
  }
  uVar6 = 0;
  if (uVar4 <= uVar8) {
    uVar6 = uVar8 - uVar4;
  }
  bVar1 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                   (ulong)((byte)specs->field_0x9 & 0xf));
  if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x18) <
      uVar4 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + (specs->fill).size_ * uVar6) {
    (*(code *)**(undefined8 **)
                out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
              (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
  }
  uVar8 = uVar6 >> (bVar1 & 0x3f);
  bVar5 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar8,&specs->fill);
  it.container = (buffer<char> *)
                 write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::big_decimal_fp,_char>
                 ::anon_class_40_7_ef14d3db::operator()
                           ((anon_class_40_7_ef14d3db *)&local_78,
                            bVar5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                            container);
LAB_004a2ad4:
  bVar5 = fill<fmt::v7::detail::buffer_appender<char>,char>
                    ((buffer_appender<char>)it.container,uVar6 - uVar8,&specs->fill);
  return (buffer_appender<char>)
         bVar5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}